

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.h
# Opt level: O1

void __thiscall cnn::Trainer::status(Trainer *this)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"[epoch=",7);
  poVar1 = std::ostream::_M_insert<double>((double)this->epoch);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," eta=",5);
  poVar1 = std::ostream::_M_insert<double>((double)this->eta);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," clips=",7);
  poVar1 = std::ostream::_M_insert<double>((double)this->clips);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," updates=",9);
  poVar1 = std::ostream::_M_insert<double>((double)this->updates);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] ",2);
  this->clips = 0.0;
  this->updates = 0.0;
  return;
}

Assistant:

void status() {
    std::cerr << "[epoch=" << epoch << " eta=" << eta << " clips=" << clips << " updates=" << updates << "] ";
    updates = clips = 0;
  }